

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgmop(fitsfile *gfptr,long member,fitsfile **mfptr,int *status)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  fitsfile *in_RCX;
  long *in_RDX;
  char *tmpPtr [1];
  char nstr [1];
  char card [81];
  char cwd [1025];
  char mbrLocation3 [1025];
  char mbrLocation2 [1025];
  char mbrLocation1 [1025];
  char grpLocation2 [1025];
  char grpLocation1 [1025];
  char uri [71];
  char extname [71];
  char xtension [71];
  long extver;
  long hdupos;
  int dummy;
  int hdutype;
  int grptype;
  int uriCol;
  int locationCol;
  int positionCol;
  int extverCol;
  int extnameCol;
  int xtensionCol;
  undefined4 uVar5;
  long *status_00;
  int iVar6;
  fitsfile *pfVar4;
  fitsfile *newfptr;
  fitsfile *openfptr;
  int in_stack_ffffffffffffe5c0;
  int in_stack_ffffffffffffe5c4;
  undefined4 in_stack_ffffffffffffe5c8;
  undefined4 in_stack_ffffffffffffe5cc;
  char *in_stack_ffffffffffffe5d8;
  int in_stack_ffffffffffffe5e0;
  undefined4 in_stack_ffffffffffffe5e4;
  int *in_stack_ffffffffffffe5e8;
  char *firstelem;
  LONGLONG in_stack_ffffffffffffe5f0;
  char local_1a08 [4];
  int in_stack_ffffffffffffe5fc;
  fitsfile *in_stack_ffffffffffffe600;
  int *in_stack_ffffffffffffe610;
  int *in_stack_ffffffffffffe618;
  undefined4 in_stack_ffffffffffffe620;
  int in_stack_ffffffffffffe624;
  fitsfile *in_stack_ffffffffffffe628;
  undefined4 in_stack_ffffffffffffe630;
  int in_stack_ffffffffffffe634;
  fitsfile *in_stack_ffffffffffffe638;
  int *in_stack_ffffffffffffe640;
  int *in_stack_ffffffffffffe648;
  int *in_stack_ffffffffffffe650;
  int *in_stack_ffffffffffffe658;
  int *in_stack_ffffffffffffe660;
  fitsfile *in_stack_ffffffffffffe668;
  int *in_stack_ffffffffffffe680;
  int *in_stack_ffffffffffffe688;
  int *in_stack_ffffffffffffe690;
  int *in_stack_ffffffffffffe9b0;
  int *in_stack_ffffffffffffe9b8;
  char *in_stack_ffffffffffffe9c0;
  char *in_stack_ffffffffffffe9c8;
  int *in_stack_ffffffffffffe9d0;
  char *in_stack_ffffffffffffe9d8;
  char *in_stack_ffffffffffffe9e0;
  char *in_stack_ffffffffffffe9e8;
  char local_1598 [1040];
  char local_1188 [1040];
  char local_d78 [1040];
  char local_968 [1040];
  char local_558 [888];
  int *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  fitsfile *in_stack_fffffffffffffe48;
  int *in_stack_fffffffffffffe60;
  undefined1 local_148 [80];
  char local_f8 [80];
  char local_a8 [72];
  long local_60 [2];
  undefined1 local_4c [12];
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  fitsfile *local_28;
  long *local_20;
  
  local_60[1] = 0;
  local_60[0] = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  memset(&stack0xffffffffffffe5f7,0,1);
  if (local_28->HDUposition != 0) {
    return local_28->HDUposition;
  }
  uVar5 = (undefined4)((ulong)&local_40 >> 0x20);
  newfptr = (fitsfile *)(local_4c + 8);
  openfptr = local_28;
  iVar1 = ffgtgc(in_stack_ffffffffffffe668,in_stack_ffffffffffffe660,in_stack_ffffffffffffe658,
                 in_stack_ffffffffffffe650,in_stack_ffffffffffffe648,in_stack_ffffffffffffe640,
                 in_stack_ffffffffffffe680,in_stack_ffffffffffffe688,in_stack_ffffffffffffe690);
  local_28->HDUposition = iVar1;
  if (local_28->HDUposition != 0) goto LAB_001ea6d0;
  status_00 = (long *)CONCAT44(uVar5,local_40);
  newfptr = local_28;
  iVar1 = ffvcfm((fitsfile *)CONCAT44(in_stack_ffffffffffffe5cc,in_stack_ffffffffffffe5c8),
                 in_stack_ffffffffffffe5c4,in_stack_ffffffffffffe5c0,(int)((ulong)openfptr >> 0x20),
                 (int)openfptr,(int)((ulong)local_28 >> 0x20),in_stack_ffffffffffffe5e0,
                 in_stack_ffffffffffffe5e8);
  local_28->HDUposition = iVar1;
  if (local_28->HDUposition != 0) goto LAB_001ea6d0;
  if (local_2c != 0) {
    status_00 = (long *)&stack0xffffffffffffe5e8;
    newfptr = (fitsfile *)local_4c;
    openfptr = local_28;
    iVar1 = ffgcvs(in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f0,
                   (LONGLONG)local_a8,CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0),
                   in_stack_ffffffffffffe5d8,
                   (char **)CONCAT44(in_stack_ffffffffffffe624,in_stack_ffffffffffffe620),
                   &in_stack_ffffffffffffe628->HDUposition,
                   (int *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630));
    local_28->HDUposition = iVar1;
    iVar1 = fits_strcasecmp((char *)openfptr,(char *)newfptr);
    if (iVar1 == 0) {
      local_4c._4_4_ = 0;
    }
    else {
      iVar1 = fits_strcasecmp((char *)openfptr,(char *)newfptr);
      if (iVar1 == 0) {
        local_4c._4_4_ = 0;
      }
      else {
        iVar1 = fits_strcasecmp((char *)openfptr,(char *)newfptr);
        if (iVar1 == 0) {
          local_4c._4_4_ = 1;
        }
        else {
          iVar1 = fits_strcasecmp((char *)openfptr,(char *)newfptr);
          if (iVar1 == 0) {
            local_4c._4_4_ = 2;
          }
          else {
            local_4c._4_4_ = 0xffffffff;
          }
        }
      }
    }
  }
  firstelem = local_f8;
  if (local_30 != 0) {
    status_00 = (long *)&stack0xffffffffffffe5e8;
    newfptr = (fitsfile *)local_4c;
    openfptr = local_28;
    iVar1 = ffgcvs(in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f0,
                   (LONGLONG)firstelem,CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0)
                   ,in_stack_ffffffffffffe5d8,
                   (char **)CONCAT44(in_stack_ffffffffffffe624,in_stack_ffffffffffffe620),
                   &in_stack_ffffffffffffe628->HDUposition,
                   (int *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630));
    local_28->HDUposition = iVar1;
  }
  if (local_34 != 0) {
    status_00 = local_60;
    newfptr = (fitsfile *)local_4c;
    openfptr = local_28;
    iVar1 = ffgcvj(in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f0,
                   (LONGLONG)firstelem,CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0)
                   ,(long)in_stack_ffffffffffffe5d8,
                   (long *)CONCAT44(in_stack_ffffffffffffe624,in_stack_ffffffffffffe620),
                   &in_stack_ffffffffffffe628->HDUposition,
                   (int *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630));
    local_28->HDUposition = iVar1;
  }
  if (local_38 != 0) {
    status_00 = local_60 + 1;
    newfptr = (fitsfile *)local_4c;
    openfptr = local_28;
    iVar1 = ffgcvj(in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f0,
                   (LONGLONG)firstelem,CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0)
                   ,(long)in_stack_ffffffffffffe5d8,
                   (long *)CONCAT44(in_stack_ffffffffffffe624,in_stack_ffffffffffffe620),
                   &in_stack_ffffffffffffe628->HDUposition,
                   (int *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630));
    local_28->HDUposition = iVar1;
  }
  if (local_3c != 0) {
    status_00 = (long *)&stack0xffffffffffffe5e8;
    newfptr = (fitsfile *)local_4c;
    openfptr = local_28;
    iVar1 = ffgcvs(in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f0,
                   (LONGLONG)local_d78,CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0)
                   ,in_stack_ffffffffffffe5d8,
                   (char **)CONCAT44(in_stack_ffffffffffffe624,in_stack_ffffffffffffe620),
                   &in_stack_ffffffffffffe628->HDUposition,
                   (int *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630));
    local_28->HDUposition = iVar1;
  }
  if (local_40 != 0) {
    status_00 = (long *)&stack0xffffffffffffe5e8;
    newfptr = (fitsfile *)local_4c;
    openfptr = local_28;
    iVar1 = ffgcvs(in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f0,
                   (LONGLONG)local_148,CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0)
                   ,in_stack_ffffffffffffe5d8,
                   (char **)CONCAT44(in_stack_ffffffffffffe624,in_stack_ffffffffffffe620),
                   &in_stack_ffffffffffffe628->HDUposition,
                   (int *)CONCAT44(in_stack_ffffffffffffe634,in_stack_ffffffffffffe630));
    local_28->HDUposition = iVar1;
  }
  if (local_28->HDUposition != 0) goto LAB_001ea6d0;
  if (local_4c._8_4_ == 0) {
LAB_001e9de4:
    sVar3 = strlen(local_d78);
    if (sVar3 == 0) {
      iVar1 = ffreopen(openfptr,(fitsfile **)newfptr,(int *)status_00);
      local_28->HDUposition = iVar1;
    }
    else {
      iVar1 = fits_strcasecmp((char *)openfptr,(char *)newfptr);
      iVar6 = (int)((ulong)status_00 >> 0x20);
      if (iVar1 != 0) {
        local_28->HDUposition = 0x68;
        snprintf(local_1a08,0x51,"Cannot open member HDU file with URI type %s (ffgmop)",local_148);
        ffpmsg((char *)0x1e9e76);
        goto LAB_001ea6d0;
      }
      iVar1 = fits_is_url_absolute
                        ((char *)CONCAT44(in_stack_ffffffffffffe5cc,in_stack_ffffffffffffe5c8));
      if (iVar1 == 0) {
        ffpmsg((char *)0x1e9f3f);
        if (local_d78[0] == '/') {
          ffpmsg((char *)0x1e9f5c);
          iVar1 = fits_url2path(in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                                in_stack_ffffffffffffe9b8);
          local_28->HDUposition = iVar1;
          ffpmsg((char *)0x1e9f91);
          iVar1 = ffopentest(in_stack_ffffffffffffe5c0,(fitsfile **)openfptr,(char *)newfptr,iVar6,
                             (int *)0x1e9fb8);
          local_28->HDUposition = iVar1;
          if (local_28->HDUposition != 0) {
            local_28->HDUposition = 0;
            ffpmsg((char *)0x1e9ff0);
            iVar1 = ffopentest(in_stack_ffffffffffffe5c0,(fitsfile **)openfptr,(char *)newfptr,iVar6
                               ,(int *)0x1ea014);
            local_28->HDUposition = iVar1;
          }
        }
        else {
          ffpmsg((char *)0x1ea031);
          pfVar4 = local_28;
          iVar1 = fits_get_url(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                               in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                               in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                               in_stack_fffffffffffffe60);
          iVar6 = (int)((ulong)pfVar4 >> 0x20);
          local_28->HDUposition = iVar1;
          if (local_558[0] == '\0') {
LAB_001ea290:
            if (local_968[0] == '\0') {
LAB_001ea4ac:
              ffpmsg((char *)0x1ea4b8);
              local_28->HDUposition = 0x156;
            }
            else {
              iVar1 = fits_is_url_absolute
                                ((char *)CONCAT44(in_stack_ffffffffffffe5cc,
                                                  in_stack_ffffffffffffe5c8));
              if ((iVar1 == 0) && (local_968[0] != '/')) {
                fits_get_cwd((char *)in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9b0);
                sVar3 = strlen(&stack0xffffffffffffe658);
                sVar2 = strlen(local_968);
                if (0x400 < sVar3 + sVar2 + 1) {
                  ffpmsg((char *)0x1ea31c);
                  local_28->HDUposition = 0x7d;
                  goto LAB_001ea4cc;
                }
                strcat(&stack0xffffffffffffe658,"/");
                strcat(&stack0xffffffffffffe658,local_968);
                strcpy(local_968,&stack0xffffffffffffe658);
              }
              iVar1 = fits_relurl2url(in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9e0,
                                      in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0);
              local_28->HDUposition = iVar1;
              if (local_28->HDUposition == 0) {
                iVar1 = fits_is_url_absolute
                                  ((char *)CONCAT44(in_stack_ffffffffffffe5cc,
                                                    in_stack_ffffffffffffe5c8));
                if (iVar1 == 0) {
                  iVar1 = fits_url2path(in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                                        in_stack_ffffffffffffe9b8);
                  local_28->HDUposition = iVar1;
                  strcpy(local_1188,local_1598);
                }
                iVar1 = ffopentest(in_stack_ffffffffffffe5c0,(fitsfile **)openfptr,(char *)newfptr,
                                   iVar6,(int *)0x1ea427);
                local_28->HDUposition = iVar1;
                if (local_28->HDUposition != 0) {
                  local_28->HDUposition = 0;
                  ffpmsg((char *)0x1ea45f);
                  iVar1 = ffopentest(in_stack_ffffffffffffe5c0,(fitsfile **)openfptr,(char *)newfptr
                                     ,iVar6,(int *)0x1ea483);
                  local_28->HDUposition = iVar1;
                  if (local_28->HDUposition != 0) {
                    local_28->HDUposition = 0;
                    goto LAB_001ea4ac;
                  }
                }
              }
            }
          }
          else {
            iVar1 = fits_is_url_absolute
                              ((char *)CONCAT44(in_stack_ffffffffffffe5cc,in_stack_ffffffffffffe5c8)
                              );
            if ((iVar1 == 0) && (local_558[0] != '/')) {
              fits_get_cwd((char *)in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9b0);
              strcat(&stack0xffffffffffffe658,"/");
              sVar3 = strlen(&stack0xffffffffffffe658);
              sVar2 = strlen(local_558);
              if (0x400 < sVar3 + sVar2 + 1) {
                ffpmsg((char *)0x1ea111);
                local_28->HDUposition = 0x7d;
                goto LAB_001ea4cc;
              }
              strcat(&stack0xffffffffffffe658,local_558);
              strcpy(local_558,&stack0xffffffffffffe658);
            }
            iVar1 = fits_relurl2url(in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9e0,
                                    in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0);
            local_28->HDUposition = iVar1;
            if (local_28->HDUposition == 0) {
              iVar1 = fits_is_url_absolute
                                ((char *)CONCAT44(in_stack_ffffffffffffe5cc,
                                                  in_stack_ffffffffffffe5c8));
              if (iVar1 == 0) {
                iVar1 = fits_url2path(in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0,
                                      in_stack_ffffffffffffe9b8);
                local_28->HDUposition = iVar1;
                strcpy(local_1188,local_1598);
              }
              iVar1 = ffopentest(in_stack_ffffffffffffe5c0,(fitsfile **)openfptr,(char *)newfptr,
                                 iVar6,(int *)0x1ea208);
              local_28->HDUposition = iVar1;
              if (local_28->HDUposition != 0) {
                local_28->HDUposition = 0;
                ffpmsg((char *)0x1ea240);
                iVar1 = ffopentest(in_stack_ffffffffffffe5c0,(fitsfile **)openfptr,(char *)newfptr,
                                   iVar6,(int *)0x1ea264);
                local_28->HDUposition = iVar1;
                if (local_28->HDUposition != 0) {
                  local_28->HDUposition = 0;
                  goto LAB_001ea290;
                }
              }
            }
          }
        }
      }
      else {
        ffpmsg((char *)0x1e9e9f);
        iVar1 = ffopentest(in_stack_ffffffffffffe5c0,(fitsfile **)openfptr,(char *)newfptr,iVar6,
                           (int *)0x1e9ec6);
        local_28->HDUposition = iVar1;
        if (local_28->HDUposition != 0) {
          local_28->HDUposition = 0;
          ffpmsg((char *)0x1e9efe);
          iVar1 = ffopentest(in_stack_ffffffffffffe5c0,(fitsfile **)openfptr,(char *)newfptr,iVar6,
                             (int *)0x1e9f22);
          local_28->HDUposition = iVar1;
        }
      }
    }
  }
  else if (local_4c._8_4_ - 1 < 3) {
    iVar1 = ffreopen(openfptr,(fitsfile **)newfptr,(int *)status_00);
    local_28->HDUposition = iVar1;
  }
  else if (local_4c._8_4_ - 0xb < 2) goto LAB_001e9de4;
LAB_001ea4cc:
  if (local_28->HDUposition != 0) goto LAB_001ea6d0;
  if (local_4c._8_4_ == 0) {
LAB_001ea5d9:
    sVar3 = strlen(local_a8);
    if (((sVar3 == 0) || (sVar3 = strlen(local_f8), sVar3 == 0)) || (local_60[0] < 1)) {
      iVar1 = ffmahd(in_stack_ffffffffffffe628,in_stack_ffffffffffffe624,in_stack_ffffffffffffe618,
                     in_stack_ffffffffffffe610);
      local_28->HDUposition = iVar1;
      if (local_28->HDUposition == 0x6b) {
        local_28->HDUposition = 0x156;
      }
    }
    else {
      iVar1 = ffmnhd(in_stack_ffffffffffffe638,in_stack_ffffffffffffe634,
                     (char *)in_stack_ffffffffffffe628,in_stack_ffffffffffffe624,
                     in_stack_ffffffffffffe618);
      local_28->HDUposition = iVar1;
      if (local_28->HDUposition == 0x12d) {
        local_28->HDUposition = 0x156;
        ffpmsg((char *)0x1ea675);
      }
    }
  }
  else {
    if (local_4c._8_4_ == 1) {
LAB_001ea56d:
      iVar1 = ffmnhd(in_stack_ffffffffffffe638,in_stack_ffffffffffffe634,
                     (char *)in_stack_ffffffffffffe628,in_stack_ffffffffffffe624,
                     in_stack_ffffffffffffe618);
      local_28->HDUposition = iVar1;
      if (local_28->HDUposition == 0x12d) {
        local_28->HDUposition = 0x156;
        ffpmsg((char *)0x1ea5d4);
      }
      goto LAB_001ea6d0;
    }
    if (local_4c._8_4_ != 2) {
      if (local_4c._8_4_ == 3) goto LAB_001ea5d9;
      if (local_4c._8_4_ == 0xb) goto LAB_001ea56d;
      if (local_4c._8_4_ != 0xc) goto LAB_001ea6d0;
    }
    iVar1 = ffmahd(in_stack_ffffffffffffe628,in_stack_ffffffffffffe624,in_stack_ffffffffffffe618,
                   in_stack_ffffffffffffe610);
    local_28->HDUposition = iVar1;
  }
LAB_001ea6d0:
  if ((local_28->HDUposition != 0) && (*local_20 != 0)) {
    ffclos(openfptr,&newfptr->HDUposition);
  }
  return local_28->HDUposition;
}

Assistant:

int ffgmop(fitsfile *gfptr,  /* FITS file pointer to grouping table          */
	   long      member, /* member ID (row num) within grouping table    */
	   fitsfile **mfptr, /* FITS file pointer to member HDU              */
	   int      *status) /* return status code                           */

/*
  open a grouping table member, returning a pointer to the member's FITS file
  with the CHDU set to the member HDU. The grouping table must be the CHDU of
  the FITS file pointed to by gfptr. The member to open is identified by its
  row number within the grouping table (first row/member == 1).

  If the member resides in a FITS file different from the grouping
  table the member file is first opened readwrite and if this fails then
  it is opened readonly. For access type of FILE:// the member file is
  searched for assuming (1) an absolute path is given, (2) a path relative
  to the CWD is given, and (3) a path relative to the grouping table file
  but not relative to the CWD is given. If all of these fail then the
  error FILE_NOT_FOUND is returned.
*/

{
  int xtensionCol,extnameCol,extverCol,positionCol,locationCol,uriCol;
  int grptype,hdutype;
  int dummy;

  long hdupos = 0;
  long extver = 0;

  char  xtension[FLEN_VALUE];
  char  extname[FLEN_VALUE];
  char  uri[FLEN_VALUE];
  char  grpLocation1[FLEN_FILENAME];
  char  grpLocation2[FLEN_FILENAME];
  char  mbrLocation1[FLEN_FILENAME];
  char  mbrLocation2[FLEN_FILENAME];
  char  mbrLocation3[FLEN_FILENAME];
  char  cwd[FLEN_FILENAME];
  char  card[FLEN_CARD];
  char  nstr[] = {'\0'};
  char *tmpPtr[1];


  if(*status != 0) return(*status);

  do
    {
      /*
	retrieve the Grouping Convention reserved column positions within
	the grouping table
      */

      *status = ffgtgc(gfptr,&xtensionCol,&extnameCol,&extverCol,&positionCol,
		       &locationCol,&uriCol,&grptype,status);

      if(*status != 0) continue;
      
      /* verify the column formats */
      
      *status = ffvcfm(gfptr,xtensionCol,extnameCol,extverCol,positionCol,
		       locationCol,uriCol,status);

      if(*status != 0) continue;
      
      /*
	 extract the member information from grouping table
      */

      tmpPtr[0] = xtension;

      if(xtensionCol != 0)
	{

	  *status = fits_read_col_str(gfptr,xtensionCol,member,1,1,nstr,
				      tmpPtr,&dummy,status);

	  /* convert the xtension string to a hdutype code */

	  if(fits_strcasecmp(xtension,"PRIMARY")       == 0) hdutype = IMAGE_HDU; 
	  else if(fits_strcasecmp(xtension,"IMAGE")    == 0) hdutype = IMAGE_HDU; 
	  else if(fits_strcasecmp(xtension,"TABLE")    == 0) hdutype = ASCII_TBL; 
	  else if(fits_strcasecmp(xtension,"BINTABLE") == 0) hdutype = BINARY_TBL; 
	  else hdutype = ANY_HDU; 
	}

      tmpPtr[0] = extname;

      if(extnameCol  != 0)
	  *status = fits_read_col_str(gfptr,extnameCol,member,1,1,nstr,
				      tmpPtr,&dummy,status);

      if(extverCol   != 0)
	  *status = fits_read_col_lng(gfptr,extverCol,member,1,1,0,
				      (long*)&extver,&dummy,status);

      if(positionCol != 0)
	  *status = fits_read_col_lng(gfptr,positionCol,member,1,1,0,
				      (long*)&hdupos,&dummy,status);

      tmpPtr[0] = mbrLocation1;

      if(locationCol != 0)
	*status = fits_read_col_str(gfptr,locationCol,member,1,1,nstr,
				    tmpPtr,&dummy,status);
      tmpPtr[0] = uri;

      if(uriCol != 0)
	*status = fits_read_col_str(gfptr,uriCol,member,1,1,nstr,
				    tmpPtr,&dummy,status);

      if(*status != 0) continue;

      /* 
	 decide what FITS file the member HDU resides in and open the file
	 using the fitsfile* pointer mfptr; note that this logic is rather
	 complicated and is based primiarly upon if a URL specifier is given
	 for the member file in the grouping table
      */

      switch(grptype)
	{

	case GT_ID_POS:
	case GT_ID_REF:
	case GT_ID_ALL:

	  /*
	     no location information is given so we must assume that the
	     member HDU resides in the same FITS file as the grouping table;
	     if the grouping table was incorrectly constructed then this
	     assumption will be false, but there is nothing to be done about
	     it at this point
	  */

	  *status = fits_reopen_file(gfptr,mfptr,status);
	  
	  break;

	case GT_ID_REF_URI:
	case GT_ID_POS_URI:
	case GT_ID_ALL_URI:

	  /*
	    The member location column exists. Determine if the member 
	    resides in the same file as the grouping table or in a
	    separate file; open the member file in either case
	  */

	  if(strlen(mbrLocation1) == 0)
	    {
	      /*
		 since no location information was given we must assume
		 that the member is in the same FITS file as the grouping
		 table
	      */

	      *status = fits_reopen_file(gfptr,mfptr,status);
	    }
	  else
	    {
	      /*
		make sure the location specifiation is "URL"; we cannot
		decode any other URI types at this time
	      */

	      if(fits_strcasecmp(uri,"URL") != 0)
		{
		  *status = FILE_NOT_OPENED;
		  snprintf(card,FLEN_CARD,
		  "Cannot open member HDU file with URI type %s (ffgmop)",
			  uri);
		  ffpmsg(card);

		  continue;
		}

	      /*
		The location string for the member is not NULL, so it 
		does not necessially reside in the same FITS file as the
		grouping table. 

		Three cases are attempted for opening the member's file
		in the following order:

		1. The URL given for the member's file is absolute (i.e.,
		access method supplied); try to open the member

		2. The URL given for the member's file is not absolute but
		is an absolute file path; try to open the member as a file
		after the file path is converted to a host-dependent form

		3. The URL given for the member's file is not absolute
	        and is given as a relative path to the location of the 
		grouping table's file. Create an absolute URL using the 
		grouping table's file URL and try to open the member.
		
		If all three cases fail then an error is returned. In each
		case the file is first opened in read/write mode and failing
		that readonly mode.
		
		The following DO loop is only used as a mechanism to break
		(continue) when the proper file opening method is found
	       */

	      do
		{
		  /*
		     CASE 1:

		     See if the member URL is absolute (i.e., includes a
		     access directive) and if so open the file
		   */

		  if(fits_is_url_absolute(mbrLocation1))
		    {
		      /*
			 the URL must specify an access method, which 
			 implies that its an absolute reference
			 
			 regardless of the access method, pass the whole
			 URL to the open function for processing
		       */
		      
		      ffpmsg("member URL is absolute, try open R/W (ffgmop)");

		      *status = fits_open_file(mfptr,mbrLocation1,READWRITE,
					       status);

		      if(*status == 0) continue;

		      *status = 0;

		      /* 
			 now try to open file using full URL specs in 
			 readonly mode 
		      */ 

		      ffpmsg("OK, now try to open read-only (ffgmop)");

		      *status = fits_open_file(mfptr,mbrLocation1,READONLY,
					       status);

		      /* break from DO loop regardless of status */

		      continue;
		    }

		  /*
		     CASE 2:

		     If we got this far then the member URL location 
		     has no access type ==> FILE:// Try to open the member 
		     file using the URL as is, i.e., assume that it is given 
		     as absolute, if it starts with a '/' character
		   */

		  ffpmsg("Member URL is of type FILE (ffgmop)");

		  if(*mbrLocation1 == '/')
		    {
		      ffpmsg("Member URL specifies abs file path (ffgmop)");

		      /* 
			 convert the URL path to a host dependent path
		      */

		      *status = fits_url2path(mbrLocation1,mbrLocation2,
					      status);

		      ffpmsg("Try to open member URL in R/W mode (ffgmop)");

		      *status = fits_open_file(mfptr,mbrLocation2,READWRITE,
					       status);

		      if(*status == 0) continue;

		      *status = 0;

		      /* 
			 now try to open file using the URL as an absolute 
			 path in readonly mode 
		      */
 
		      ffpmsg("OK, now try to open read-only (ffgmop)");

		      *status = fits_open_file(mfptr,mbrLocation2,READONLY,
					       status);

		      /* break from the Do loop regardless of the status */

		      continue;
		    }
		  
		  /* 
		     CASE 3:

		     If we got this far then the URL does not specify an
		     absoulte file path or URL with access method. Since 
		     the path to the group table's file is (obviously) valid 
		     for the CWD, create a full location string for the
		     member HDU using the grouping table URL as a basis

		     The only problem is that the grouping table file might
		     have two URLs, the original one used to open it and
		     the one that points to the real file being accessed
		     (i.e., a file accessed via HTTP but transferred to a
		     local disk file). Have to attempt to build a URL to
		     the member HDU file using both of these URLs if
		     defined.
		  */

		  ffpmsg("Try to open member file as relative URL (ffgmop)");

		  /* get the URL information for the grouping table file */

		  *status = fits_get_url(gfptr,grpLocation1,grpLocation2,
					 NULL,NULL,NULL,status);

		  /* 
		     if the "real" grouping table file URL is defined then
		     build a full url for the member HDU file using it
		     and try to open the member HDU file
		  */

		  if(*grpLocation1)
		    {
		      /* make sure the group location is absolute */

		      if(! fits_is_url_absolute(grpLocation1) &&
			                              *grpLocation1 != '/')
			{
			  fits_get_cwd(cwd,status);
			  strcat(cwd,"/");
                          if (strlen(cwd)+strlen(grpLocation1)+1 > 
                                    FLEN_FILENAME-1)
                          {
                             ffpmsg("cwd and group location1 is too long (ffgmop)");
                             *status = URL_PARSE_ERROR;
                             continue;
                          }
			  strcat(cwd,grpLocation1);
			  strcpy(grpLocation1,cwd);
			}

		      /* create a full URL for the member HDU file */

		      *status = fits_relurl2url(grpLocation1,mbrLocation1,
						mbrLocation2,status);

		      if(*status != 0) continue;

		      /*
			if the URL does not have an access method given then
			translate it into a host dependent file path
		      */

		      if(! fits_is_url_absolute(mbrLocation2))
			{
			  *status = fits_url2path(mbrLocation2,mbrLocation3,
						  status);
			  strcpy(mbrLocation2,mbrLocation3);
			}

		      /* try to open the member file READWRITE */

		      *status = fits_open_file(mfptr,mbrLocation2,READWRITE,
					       status);

		      if(*status == 0) continue;

		      *status = 0;
		  
		      /* now try to open in readonly mode */ 

		      ffpmsg("now try to open file as READONLY (ffgmop)");

		      *status = fits_open_file(mfptr,mbrLocation2,READONLY,
					       status);

		      if(*status == 0) continue;

		      *status = 0;
		    }

		  /* 
		     if we got this far then either the "real" grouping table
		     file URL was not defined or all attempts to open the
		     resulting member HDU file URL failed.

		     if the "original" grouping table file URL is defined then
		     build a full url for the member HDU file using it
		     and try to open the member HDU file
		  */

		  if(*grpLocation2)
		    {
		      /* make sure the group location is absolute */

		      if(! fits_is_url_absolute(grpLocation2) &&
			                              *grpLocation2 != '/')
			{
			  fits_get_cwd(cwd,status);
                          if (strlen(cwd)+strlen(grpLocation2)+1 > 
                                    FLEN_FILENAME-1)
                          {
                             ffpmsg("cwd and group location2 is too long (ffgmop)");
                             *status = URL_PARSE_ERROR;
                             continue;
                          }
			  strcat(cwd,"/");
			  strcat(cwd,grpLocation2);
			  strcpy(grpLocation2,cwd);
			}

		      /* create an absolute URL for the member HDU file */

		      *status = fits_relurl2url(grpLocation2,mbrLocation1,
						mbrLocation2,status);
		      if(*status != 0) continue;

		      /*
			if the URL does not have an access method given then
			translate it into a host dependent file path
		      */

		      if(! fits_is_url_absolute(mbrLocation2))
			{
			  *status = fits_url2path(mbrLocation2,mbrLocation3,
						  status);
			  strcpy(mbrLocation2,mbrLocation3);
			}

		      /* try to open the member file READWRITE */

		      *status = fits_open_file(mfptr,mbrLocation2,READWRITE,
					       status);

		      if(*status == 0) continue;

		      *status = 0;
		  
		      /* now try to open in readonly mode */ 

		      ffpmsg("now try to open file as READONLY (ffgmop)");

		      *status = fits_open_file(mfptr,mbrLocation2,READONLY,
					       status);

		      if(*status == 0) continue;

		      *status = 0;
		    }

		  /*
		     if we got this far then the member HDU file could not
		     be opened using any method. Log the error.
		  */

		  ffpmsg("Cannot open member HDU FITS file (ffgmop)");
		  *status = MEMBER_NOT_FOUND;
		  
		}while(0);
	    }

	  break;

	default:

	  /* no default action */
	  
	  break;
	}
	  
      if(*status != 0) continue;

      /*
	 attempt to locate the member HDU within its FITS file as determined
	 and opened above
      */

      switch(grptype)
	{

	case GT_ID_POS:
	case GT_ID_POS_URI:

	  /*
	    try to find the member hdu in the the FITS file pointed to
	    by mfptr based upon its HDU posistion value. Note that is 
	    impossible to verify if the HDU is actually the correct HDU due 
	    to a lack of information.
	  */
	  
	  *status = fits_movabs_hdu(*mfptr,(int)hdupos,&hdutype,status);

	  break;

	case GT_ID_REF:
	case GT_ID_REF_URI:

	  /*
	     try to find the member hdu in the FITS file pointed to
	     by mfptr based upon its XTENSION, EXTNAME and EXTVER keyword 
	     values
	  */

	  *status = fits_movnam_hdu(*mfptr,hdutype,extname,extver,status);

	  if(*status == BAD_HDU_NUM) 
	    {
	      *status = MEMBER_NOT_FOUND;
	      ffpmsg("Cannot find specified member HDU (ffgmop)");
	    }

	  /*
	     if the above function returned without error then the
	     mfptr is pointed to the member HDU
	  */

	  break;

	case GT_ID_ALL:
	case GT_ID_ALL_URI:

	  /*
	     if the member entry has reference information then use it
             (ID by reference is safer than ID by position) else use
	     the position information
	  */

	  if(strlen(xtension) > 0 && strlen(extname) > 0 && extver > 0)
	    {
	      /* valid reference info exists so use it */
	      
	      /* try to find the member hdu in the grouping table's file */

	      *status = fits_movnam_hdu(*mfptr,hdutype,extname,extver,status);

	      if(*status == BAD_HDU_NUM) 
		{
		  *status = MEMBER_NOT_FOUND;
		  ffpmsg("Cannot find specified member HDU (ffgmop)");
		}
	    }
	  else
	      {
		  *status = fits_movabs_hdu(*mfptr,(int)hdupos,&hdutype,
					    status);
		  if(*status == END_OF_FILE) *status = MEMBER_NOT_FOUND;
	      }

	  /*
	     if the above function returned without error then the
	     mfptr is pointed to the member HDU
	  */

	  break;

	default:

	  /* no default action */

	  break;
	}
      
    }while(0);

  if(*status != 0 && *mfptr != NULL) 
    {
      fits_close_file(*mfptr,status);
    }

  return(*status);
}